

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall singleParticleSpectra::output_spectra_and_Qn_results(singleParticleSpectra *this)

{
  long in_RDI;
  singleParticleSpectra *in_stack_00000500;
  singleParticleSpectra *in_stack_00000520;
  singleParticleSpectra *in_stack_00000530;
  singleParticleSpectra *in_stack_00000ce0;
  singleParticleSpectra *in_stack_00000f30;
  singleParticleSpectra *in_stack_00000fd0;
  singleParticleSpectra *in_stack_00000ff0;
  singleParticleSpectra *in_stack_000014a0;
  singleParticleSpectra *in_stack_00001c30;
  
  output_Qn_vectors(in_stack_00000ce0);
  if (*(int *)(in_RDI + 0x250) == 1) {
    output_rapidity_distribution(in_stack_00000530);
    if (*(int *)(in_RDI + 0x3c0) == 1) {
      outputRapidityPTDistribution(in_stack_00000520);
    }
    if (*(int *)(in_RDI + 0x3e0) == 1) {
      output_two_particle_correlation_rap(in_stack_00000f30);
      output_three_particle_correlation_rap(in_stack_00001c30);
    }
  }
  if (*(int *)(in_RDI + 0x7c8) == 1) {
    output_dNdSV(in_stack_000014a0);
  }
  if (*(int *)(in_RDI + 0x3e0) == 1) {
    output_two_particle_correlation(in_stack_00000ff0);
    output_three_particle_correlation(in_stack_00000fd0);
    output_four_particle_Cn4_correlation(in_stack_00000500);
    output_four_particle_SC_correlation(in_stack_00000500);
  }
  return;
}

Assistant:

void singleParticleSpectra::output_spectra_and_Qn_results() {
    output_Qn_vectors();
    if (rapidity_distribution_flag == 1) {
        output_rapidity_distribution();

        if (rapidityPTDistributionFlag_ == 1) {
            outputRapidityPTDistribution();
        }

        if (flag_correlation == 1) {
            output_two_particle_correlation_rap();
            output_three_particle_correlation_rap();
        }
    }
    if (check_spatial_flag == 1) output_dNdSV();
    if (flag_correlation == 1) {
        output_two_particle_correlation();
        output_three_particle_correlation();
        output_four_particle_Cn4_correlation();
        output_four_particle_SC_correlation();
    }
}